

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

void encoderEngine(Territory ccode,EncodeRec *enc,int stop_with_one_result,int extraDigits,
                  int requiredEncoder,Territory ccode_override)

{
  ushort *puVar1;
  char *pcVar2;
  int firstcode;
  uint uVar3;
  Mapcodes *pMVar4;
  int *piVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  int iVar20;
  int height;
  uint uVar21;
  char (*territoryISO) [29];
  int x;
  int iVar22;
  int iVar23;
  TerritoryBoundary *b;
  char cVar24;
  char *result_00;
  ulong uVar25;
  int GOODROUNDER;
  int iVar26;
  uint y;
  undefined *puVar27;
  undefined *puVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int *piVar33;
  bool bVar34;
  int *local_e8;
  undefined8 local_c0;
  char result [128];
  
  uVar25 = (ulong)(uint)ccode_override;
  if (999 < ccode && enc != (EncodeRec *)0x0) {
    firstcode = *(int *)("" + (long)ccode * 4 + 0x28c);
    lVar30 = (long)firstcode;
    local_c0 = (long)DATA_START[(uint)(ccode + 0xfffffc18)];
    lVar16 = local_c0 + -1;
    iVar8 = fitsInsideBoundaries(&enc->coord32,TERRITORY_BOUNDARIES + lVar16);
    if (iVar8 != 0) {
      result[0] = '\0';
      if (requiredEncoder == -1) {
        requiredEncoder = ccode;
      }
      iVar20 = firstcode + -1;
      puVar27 = &UNK_00254eec + lVar30 * 0x14;
      local_e8 = &TERRITORY_BOUNDARIES[lVar30].flags;
      iVar8 = 0;
LAB_001cf824:
      if (lVar30 < local_c0) {
        b = TERRITORY_BOUNDARIES + lVar30;
        iVar9 = fitsInsideBoundaries(&enc->coord32,b);
        if (iVar9 == 0) goto LAB_001cfed3;
        uVar11 = TERRITORY_BOUNDARIES[lVar30].flags;
        iVar9 = (int)uVar11 >> 0x10;
        iVar23 = (int)lVar30;
        if ((uVar11 & 0x40) != 0) {
          iVar15 = countNamelessRecords(iVar23,firstcode);
          iVar32 = firstNamelessRecord(iVar23,firstcode);
          iVar32 = iVar23 - iVar32;
          result[0] = '\0';
          iVar23 = coDex(iVar23);
          uVar7 = (ushort)iVar23 & 0xff;
          if (iVar15 < 0x20 && iVar23 != 0x15) {
            iVar22 = (int)(0x1f % (long)iVar15);
            if (iVar32 < iVar22) {
              iVar22 = iVar32;
            }
            iVar22 = (iVar22 + (int)(0x1f / (long)iVar15) * iVar32) * 0xe1781;
          }
          else if (iVar15 < 0x3e && iVar23 != 0x15) {
            if (iVar32 < 0x3e - iVar15) {
              iVar22 = iVar32 * 0xe1781;
            }
            else {
              iVar26 = ((iVar32 + iVar15 + -0x3e) / 2 + (0x3e - iVar15)) * 0xe1781;
              iVar22 = iVar26 + 0x745f0;
              if ((iVar32 + iVar15 & 1U) == 0) {
                iVar22 = iVar26;
              }
            }
          }
          else {
            lVar17 = 0x1b4d89f;
            if (iVar23 == 0x15) {
              lVar17 = 0xe1781;
            }
            iVar22 = (int)(lVar17 / (long)iVar15);
            if (iVar15 == 0x3e) {
              iVar22 = iVar22 + 1;
            }
            else {
              iVar22 = iVar22 - (int)((long)((ulong)(uint)(iVar22 >> 0x1f) << 0x20 |
                                            lVar17 / (long)iVar15 & 0xffffffffU) % 0x3c1);
            }
            iVar22 = iVar22 * iVar32;
          }
          uVar10 = TERRITORY_BOUNDARIES[lVar30].miny;
          iVar32 = TERRITORY_BOUNDARIES[lVar30].maxy;
          uVar12 = uVar10;
          if ((int)uVar10 < 0) {
            iVar26 = 0x168;
            if (iVar32 < 0) {
              uVar12 = -iVar32;
              goto LAB_001cfc4e;
            }
          }
          else {
LAB_001cfc4e:
            iVar26 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar12 >> 0x13) * 4);
          }
          iVar29 = (enc->coord32).lonMicroDeg - b->minx;
          x = (enc->fraclon / 810000 + iVar29 * 4) / iVar26;
          iVar13 = iVar32 - (enc->coord32).latMicroDeg;
          iVar14 = iVar13 / 0x5a;
          iVar13 = iVar13 % 0x5a;
          if (iVar13 == 0) {
            iVar13 = 0;
            if (0 < enc->fraclat) {
              iVar13 = 0x5a;
            }
            iVar14 = iVar14 - (uint)(0 < enc->fraclat);
          }
          if ((uVar11 >> 10 & 1) == 0) {
            iVar14 = iVar14 + x * iVar9;
          }
          else {
            iVar32 = (int)(iVar32 - uVar10) / 0x5a;
            height = iVar32 + 1;
            iVar14 = encodeSixWide(x,iVar32 - iVar14,
                                   (int)((long)(ulong)(uint)(iVar9 * iVar9) / (long)height),height);
          }
          bVar6 = (char)(uVar7 / 10) + (char)(uVar7 % 10);
          encodeBase31(result,iVar14 + iVar22,bVar6 + 1);
          lVar17 = (long)(int)((uint)bVar6 - (uint)(iVar23 == 0xd));
          *(undefined4 *)(result + lVar17) = *(undefined4 *)(result + lVar17 + -1);
          result[lVar17 + -1] = '.';
          if (((((uVar11 >> 10 & 1) == 0) && (iVar9 == 0x3c1)) && (iVar23 == 0x16)) &&
             (iVar15 < 0x3e)) {
            cVar24 = result[(ulong)bVar6 - 2];
            result[(ulong)bVar6 - 2] = result[bVar6];
            result[bVar6] = cVar24;
          }
          iVar9 = iVar29 * 4 - x * iVar26;
          iVar23 = 0x5a;
          goto LAB_001cfdb4;
        }
        if ((uVar11 >> 8 & 1) != 0) {
          uVar11 = coDex(iVar23);
          piVar5 = local_e8;
          lVar17 = 0;
          puVar28 = puVar27;
          iVar9 = iVar20;
          do {
            lVar31 = lVar17;
            piVar33 = piVar5;
            if ((puVar28[1] & 1) == 0) break;
            uVar10 = coDex(iVar9);
            iVar9 = iVar9 + -1;
            puVar28 = puVar28 + -0x14;
            piVar5 = piVar33 + -5;
            lVar17 = lVar31 + 1;
          } while (uVar10 == uVar11);
          iVar9 = 0xe1781;
          if (0x16 < uVar11) {
            iVar9 = 0x1b4d89f;
          }
          iVar15 = 0;
          do {
            uVar10 = piVar33[-3];
            uVar12 = piVar33[-1];
            iVar23 = uVar12 - uVar10;
            if ((int)uVar10 < 0) {
              iVar32 = 0x168;
              if ((int)uVar12 < 0) {
                uVar10 = -uVar12;
                goto LAB_001cf9eb;
              }
            }
            else {
LAB_001cf9eb:
              iVar32 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar10 >> 0x13) * 4);
            }
            iVar14 = piVar33[-2] - ((TerritoryBoundary *)(piVar33 + -4))->minx;
            iVar22 = ((iVar23 + 0x59) / 0x5a + 0xaf) / 0xb0;
            iVar26 = ((iVar32 + iVar14 * 4 + -1) / iVar32 + 0xa7) / 0xa8;
            iVar32 = iVar22 * iVar26 * 0x745f;
            if ((*piVar33 & 0x180U) == 0x100) {
              iVar32 = iVar32 + iVar15 + iVar9 + -1;
              iVar32 = iVar32 - (iVar32 % iVar9 + iVar15);
            }
            bVar34 = lVar31 == 0;
            lVar31 = lVar31 + -1;
            if (bVar34) goto LAB_001cfad2;
            iVar15 = iVar32 + iVar15;
            piVar33 = piVar33 + 5;
          } while( true );
        }
        if ((((uint)(ccode + ~TERRITORY_AAA) < 0xfffffdeb) || (lVar30 != lVar16)) ||
           ((long)""[(uint)(ccode + ~_TERRITORY_MIN)] == 0)) {
          if (((iVar8 == 0) && ((uVar11 & 0x200) != 0)) || (uVar10 = coDex(iVar23), 0x35 < uVar10))
          goto LAB_001cfdca;
          if ((char)uVar11 < '\0') {
            cVar24 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar11 >> 0xb & 0x1f];
          }
          else {
            cVar24 = '\0';
          }
          uVar11 = uVar10;
          if (uVar10 == 0xe) {
            uVar11 = 0x17;
          }
          if (uVar10 == 0x15) {
            uVar11 = 0x16;
          }
          result[0] = '\0';
          uVar7 = (ushort)uVar11 & 0xff;
          bVar6 = (byte)(uVar7 / 10);
          uVar25 = (ulong)bVar6;
          if (iVar9 == 1) {
            iVar23 = *(int *)((long)X_SIDE + (ulong)((uint)bVar6 * 4));
            iVar9 = *(int *)((long)Y_SIDE + (ulong)((uint)bVar6 * 4));
          }
          else {
            iVar23 = NC[uVar25] / iVar9;
          }
          uVar12 = b->minx;
          uVar3 = TERRITORY_BOUNDARIES[lVar30].miny;
          iVar26 = (int)(~uVar3 + TERRITORY_BOUNDARIES[lVar30].maxy + iVar9) / iVar9;
          iVar22 = (int)(~uVar12 + TERRITORY_BOUNDARIES[lVar30].maxx + iVar23) / iVar23;
          iVar15 = (enc->coord32).latMicroDeg;
          iVar32 = (enc->coord32).lonMicroDeg;
          uVar21 = iVar32 - uVar12;
          if ((int)uVar21 < 0) {
            iVar13 = 360000000;
LAB_001cffc8:
            uVar21 = uVar21 + iVar13;
            iVar32 = iVar32 + iVar13;
          }
          else if (359999999 < uVar21) {
            iVar13 = -360000000;
            goto LAB_001cffc8;
          }
          y = (int)(iVar15 - uVar3) / iVar26;
          iVar13 = (int)uVar21 / iVar22;
          if ((iVar23 <= iVar13) || (iVar9 <= (int)y)) goto LAB_001cfdca;
          if ((uVar11 < 0x1e) || (iVar23 == iVar9)) {
            iVar14 = ~y + iVar9 + iVar13 * iVar9;
          }
          else {
            iVar14 = encodeSixWide(iVar13,y,iVar23,iVar9);
          }
          uVar19 = (ulong)(cVar24 != '\0');
          result_00 = result + uVar19;
          encodeBase31(result_00,iVar14,(uint)bVar6);
          if (((iVar9 == 0x3c1) && (uVar11 - 0x28 < 10)) && (iVar23 == 0x3c1)) {
            puVar1 = (ushort *)(result + uVar19 + 1);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          }
          uVar11 = (uint)(byte)(uVar7 % 10);
          iVar9 = *(int *)((long)Y_SIDE + (ulong)(uVar11 * 4));
          iVar14 = (iVar26 + iVar9 + -1) / iVar9;
          iVar23 = *(int *)((long)X_SIDE + (ulong)(uVar11 * 4));
          iVar23 = (iVar22 + iVar23 + -1) / iVar23;
          iVar32 = iVar32 - (uVar12 + iVar13 * iVar22);
          pcVar2 = result_00 + uVar25;
          *pcVar2 = '.';
          iVar13 = iVar32 / iVar23;
          iVar15 = iVar15 - (uVar3 + y * iVar26);
          iVar22 = ~(iVar15 / iVar14) + iVar9;
          if (uVar11 == 3) {
            encodeTriple(pcVar2 + 1,iVar13,iVar22);
          }
          else {
            encodeBase31(pcVar2 + 1,iVar22 + iVar13 * iVar9,uVar11);
            if (uVar11 == 4) {
              puVar1 = (ushort *)(result_00 + uVar25 + 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
          }
          if (uVar10 == 0xe) {
            result[uVar19 + 2] = result[uVar19 + 1];
            result[uVar19 + 1] = '.';
          }
          uVar25 = (ulong)(uint)extraDigits;
          encodeExtension(result_00,iVar32 % iVar23 << 2,iVar15 % iVar14,iVar23 << 2,iVar14,
                          extraDigits,1,enc);
          if (cVar24 == '\0') goto LAB_001cfdca;
          goto LAB_001cfdd8;
        }
        encoderEngine(PARENT_NR[""[(uint)(ccode + ~_TERRITORY_MIN)]],enc,stop_with_one_result,
                      extraDigits,ccode,(Territory)uVar25);
      }
    }
  }
  return;
LAB_001cfad2:
  iVar23 = (iVar23 + iVar22 * 0xb0 + -1) / (iVar22 * 0xb0);
  iVar13 = uVar12 - (enc->coord32).latMicroDeg;
  iVar9 = iVar13 / iVar23;
  iVar13 = iVar13 % iVar23;
  if (iVar13 == 0) {
    iVar13 = 0;
    if (0 < enc->fraclat) {
      iVar13 = iVar23;
    }
    iVar9 = iVar9 - (uint)(0 < enc->fraclat);
  }
  iVar32 = (enc->coord32).lonMicroDeg - ((TerritoryBoundary *)(piVar33 + -4))->minx;
  iVar26 = iVar26 * 0xa8;
  iVar26 = (iVar14 + iVar26 + -1) / iVar26;
  uVar25 = (long)iVar32 / (long)iVar26;
  uVar25 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
  uVar11 = uVar11 % 10 + uVar11 / 10;
  encodeBase31(result,iVar15 / 0x745f + iVar9 / 0xb0 + iVar22 * (int)((long)uVar25 / 0xa8),
               uVar11 - 2);
  result[(ulong)uVar11 - 2] = '.';
  encodeTriple(result + ((ulong)uVar11 - 1),(int)((long)uVar25 % 0xa8),iVar9 % 0xb0);
  iVar9 = iVar32 % iVar26 << 2;
  iVar26 = iVar26 << 2;
LAB_001cfdb4:
  uVar25 = (ulong)(uint)extraDigits;
  encodeExtension(result,iVar9,iVar13,iVar26,iVar23,extraDigits,-1,enc);
LAB_001cfdca:
  cVar24 = result[0];
  if (result[0] != '\0') {
LAB_001cfdd8:
    result[0] = cVar24;
    repackIfAllDigits(result,0);
    if ((result[0] != '\0') && (pMVar4 = enc->mapcodes, pMVar4 != (Mapcodes *)0x0)) {
      iVar9 = pMVar4->count;
      if ((long)iVar9 < 0x16) {
        pMVar4->count = iVar9 + 1;
        territoryISO = pMVar4->mapcode + iVar9;
        if (requiredEncoder == TERRITORY_AAA) {
          strcpy(*territoryISO,result);
        }
        else {
          getTerritoryIsoName(*territoryISO,requiredEncoder,0);
          sVar18 = strlen(*territoryISO);
          (*territoryISO + sVar18)[0] = ' ';
          (*territoryISO + sVar18)[1] = '\0';
          strcat(*territoryISO,result);
        }
      }
    }
    if (stop_with_one_result != 0) {
      return;
    }
    if (lVar30 == -1) {
      return;
    }
    iVar8 = iVar8 + 1;
    result[0] = '\0';
  }
LAB_001cfed3:
  lVar30 = lVar30 + 1;
  iVar20 = iVar20 + 1;
  puVar27 = puVar27 + 0x14;
  local_e8 = local_e8 + 5;
  goto LAB_001cf824;
}

Assistant:

static void encoderEngine(const enum Territory ccode, const EncodeRec *enc, const int stop_with_one_result,
                          const int extraDigits, const int requiredEncoder, const enum Territory ccode_override) {
    int from;
    int upto;
    ASSERT(enc);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (!enc || (ccode < _TERRITORY_MIN)) {
        return;
    } // bad arguments

    from = firstRec(ccode);
    upto = lastRec(ccode);

    if (!fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(upto))) {
        return;
    }

    ///////////////////////////////////////////////////////////
    // look for encoding options
    ///////////////////////////////////////////////////////////
    {
        int i;
        char result[128];
        int result_counter = 0;

        *result = 0;
        for (i = from; i <= upto; i++) {
            if (fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(i))) {
                if (IS_NAMELESS(i)) {
                    encodeNameless(result, enc, ccode, extraDigits, i);
                } else if (REC_TYPE(i) > 1) {
                    encodeAutoHeader(result, enc, i, extraDigits);
                } else if ((i == upto) && isSubdivision(ccode)) {
                    // *** do a recursive call for the parent ***
                    encoderEngine(parentTerritoryOf(ccode), enc, stop_with_one_result, extraDigits, requiredEncoder,
                                  ccode);
                    return;
                } else // must be grid
                {
                    // skip IS_RESTRICTED records unless there already is a result
                    if (result_counter || !IS_RESTRICTED(i)) {
                        if (coDex(i) < 54) {
                            char headerletter = (char) ((REC_TYPE(i) == 1) ? HEADER_LETTER(i) : 0);
                            encodeGrid(result, enc, i, extraDigits, headerletter);
                        }
                    }
                }

                // =========== handle result (if any)
                if (*result) {
                    result_counter++;

                    repackIfAllDigits(result, 0);

                    if ((requiredEncoder < 0) || (requiredEncoder == i)) {
                        const enum Territory ccodeFinal = (ccode_override != TERRITORY_NONE ? ccode_override : ccode);
                        if (*result && enc->mapcodes && (enc->mapcodes->count < MAX_NR_OF_MAPCODE_RESULTS)) {
                            char *s = enc->mapcodes->mapcode[enc->mapcodes->count++];
                            if (ccodeFinal == TERRITORY_AAA) { // AAA is never shown with territory
                                strcpy(s, result);
                            } else {
                                getTerritoryIsoName(s, ccodeFinal, 0);
                                strcat(s, " ");
                                strcat(s, result);
                            }
                        }
                        if (requiredEncoder == i) {
                            return;
                        }
                    }
                    if (stop_with_one_result) {
                        return;
                    }
                    *result = 0; // clear for next iteration
                }
            }
        } // for i
    }
}